

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
FactoredDecPOMDPDiscrete::SetRewardForLRF
          (FactoredDecPOMDPDiscrete *this,Index LRF,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,Scope *Y,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys,Scope *O,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Os,double reward)

{
  reference X;
  reference A;
  double dVar1;
  double dVar2;
  
  dVar1 = (double)(**(code **)(*(long *)&(this->
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                         super_MultiAgentDecisionProcess + 0x270))();
  X = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_sfScopes,(ulong)LRF);
  A = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_agScopes,(ulong)LRF);
  dVar2 = TwoStageDynamicBayesianNetwork::GetYOProbability
                    (&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn,X,Xs,A,
                     As,Y,Ys,O,Os);
  SetRewardForLRF(this,LRF,Xs,As,dVar2 * reward + dVar1);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::SetRewardForLRF(Index LRF,
            const vector<Index>& Xs,
            const vector<Index>& As,
            const Scope& Y,
            const vector<Index>& Ys,
            const Scope& O,
            const vector<Index>& Os,
            double reward
        )
{
#if DEBUG_SETR 
    string indent = "\t";
    cerr<<indent;
    cerr<< "SetRewardForLRF with Y and O scopes called: LRF="<<LRF<<
        ", r="<<reward<<endl;
#endif
    double r_xa = GetLRFReward(LRF, Xs, As);
    double P_yo_xa = GetYOProbability( 
            _m_sfScopes.at(LRF), Xs,
            _m_agScopes.at(LRF), As,
            Y, Ys,
            O, Os);
    double r_weighted = P_yo_xa * reward;
    r_xa += r_weighted;
    SetRewardForLRF(LRF, Xs, As, r_xa);
}